

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_algoim_K.H
# Opt level: O3

void __thiscall
amrex::algoim::
ImplicitIntegral<1,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<2,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true>,_false>,_false>
::evalIntegrand(ImplicitIntegral<1,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<2,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true>,_false>,_false>
                *this,GpuArray<double,_3U> x,Real w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  EBPlane *pEVar10;
  GpuArray<double,_3U> x_00;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  int dim_1;
  byte bVar14;
  long lVar15;
  int dim;
  long lVar16;
  double dVar17;
  GpuArray<double,_4U> roots;
  double local_80;
  double local_78 [4];
  ulong local_58;
  ulong local_50;
  Real local_48;
  double local_40;
  double local_38;
  
  local_78[0] = -0.5;
  pEVar10 = this->phi;
  iVar8 = this->e0;
  dVar1 = (pEVar10->norm).arr[iVar8];
  uVar11 = 1;
  if (((dVar1 != 0.0) || (NAN(dVar1))) && (iVar9 = this->psiCount, 0 < (long)iVar9)) {
    dVar2 = (pEVar10->cent).arr[0];
    dVar3 = (pEVar10->cent).arr[1];
    dVar4 = (pEVar10->norm).arr[0];
    dVar5 = (pEVar10->norm).arr[1];
    dVar6 = (pEVar10->cent).arr[2];
    dVar7 = (pEVar10->norm).arr[2];
    lVar15 = 0;
    do {
      lVar16 = 0;
      do {
        if ((this->free).arr[lVar16] == false) {
          x.arr[lVar16] =
               *(double *)
                (&DAT_006687a0 +
                (ulong)(((this->psi).arr[lVar15].bits >> ((uint)lVar16 & 0x1f) & 1) == 0) * 8);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
      x.arr[iVar8] = -0.5;
      dVar17 = -0.5 - ((x.arr[2] - dVar6) * dVar7 +
                      (x.arr[1] - dVar3) * dVar5 + (x.arr[0] - dVar2) * dVar4) / dVar1;
      if (ABS(dVar17) < 0.5) {
        lVar16 = (long)(int)uVar11;
        uVar11 = uVar11 + 1;
        local_78[lVar16] = dVar17;
      }
      dVar17 = local_78[1];
      lVar15 = lVar15 + 1;
    } while (lVar15 != iVar9);
    if (uVar11 != 3) {
      local_78[(int)uVar11] = 0.5;
      if ((int)uVar11 < 1) {
        return;
      }
      goto LAB_0064095f;
    }
    uVar11 = 3;
    if (local_78[2] < local_78[1]) {
      local_78[1] = local_78[2];
      local_78[2] = dVar17;
    }
  }
  local_78[uVar11] = 0.5;
LAB_0064095f:
  local_58 = (ulong)uVar11;
  local_80 = local_78[0];
  local_50 = 0;
  local_48 = w;
  do {
    dVar1 = local_78[local_50 + 1];
    local_40 = dVar1 - local_80;
    if (1.1102230246251565e-14 <= local_40) {
      x.arr[this->e0] = (dVar1 + local_80) * 0.5;
      iVar8 = this->psiCount;
      if (0 < (long)iVar8) {
        pEVar10 = this->phi;
        dVar2 = (pEVar10->cent).arr[0];
        dVar3 = (pEVar10->cent).arr[1];
        dVar4 = (pEVar10->norm).arr[0];
        dVar5 = (pEVar10->norm).arr[1];
        dVar6 = (pEVar10->cent).arr[2];
        dVar7 = (pEVar10->norm).arr[2];
        uVar12 = 0;
        do {
          lVar15 = 0;
          do {
            if ((this->free).arr[lVar15] == false) {
              x.arr[lVar15] =
                   *(double *)
                    (&DAT_006687a0 +
                    (ulong)(((this->psi).arr[uVar12].bits >> ((uint)lVar15 & 0x1f) & 1) == 0) * 8);
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          bVar14 = (this->psi).arr[uVar12].bits & 0x18;
          bVar13 = ((x.arr[2] - dVar6) * dVar7 +
                    (x.arr[1] - dVar3) * dVar5 + (x.arr[0] - dVar2) * dVar4 <= 0.0) * '\x10';
        } while ((bVar14 != bVar13) && (uVar12 = uVar12 + 1, uVar12 < (ulong)(long)iVar8));
        if (bVar14 == bVar13) goto LAB_00640b11;
      }
      lVar15 = 0;
      local_38 = local_80;
      do {
        x.arr[this->e0] = *(double *)((long)&DAT_00681680 + lVar15) * local_40 + local_38;
        x_00.arr[1] = x.arr[1];
        x_00.arr[0] = x.arr[0];
        x_00.arr[2] = x.arr[2];
        ImplicitIntegral<2,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true>,_false>
        ::evalIntegrand(this->f,x_00,*(double *)((long)&DAT_006816a0 + lVar15) * local_40 * w);
        lVar15 = lVar15 + 8;
        w = local_48;
      } while (lVar15 != 0x20);
    }
LAB_00640b11:
    local_50 = local_50 + 1;
    local_80 = dVar1;
    if (local_50 == local_58) {
      return;
    }
  } while( true );
}

Assistant:

AMREX_GPU_HOST_DEVICE
    void evalIntegrand (GpuArray<Real,N> x, Real w) const noexcept
    {
        constexpr Real gauss_x[4]={0.069431844202973712388026755553595247452_rt,
                                   0.33000947820757186759866712044837765640_rt,
                                   0.66999052179242813240133287955162234360_rt,
                                   0.93056815579702628761197324444640475255_rt};
        constexpr Real gauss_w[4]={0.173927422568726928686531974610999703618_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.173927422568726928686531974610999703618_rt};

        // Each thread has its own storage for computing roots. These
        // are not corrupted by the recursive chain of evalIntegrand()
        // calls since each call is in a different templated
        // namespace. Moreover, if using OpenMP tasking, each task is
        // assumed tied and so one thread can only execute
        // "evalIntegrand" from start to end uninterrupted.
        GpuArray<Real,4> roots;

        // Surface integral
        if (S)
        {
            AMREX_ASSERT(M == N && N >= 2); // x is thus valid in all variables except e0

            Real x_min = xrange.min(e0);
            Real x_max = xrange.max(e0);
            int nroots = 0;

            x[e0] = x_min;
            Real phi_lo = phi(x);
            Real xroot = x[e0] - phi_lo / phi.grad(e0);
            if (xroot > x_min && xroot < x_max) {
                roots[nroots++] = xroot;
            }

            AMREX_ASSERT(nroots <= 1);

            for (int i = 0; i < nroots; ++i)
            {
                x[e0] = roots[i];
                Real mag = 0._rt;
                for (int dim = 0; dim < N; ++dim) {
                    mag += phi.grad(dim)*phi.grad(dim);
                }
                mag = std::sqrt(mag);
                f.evalIntegrand(x, (mag/amrex::Math::abs(phi.grad(e0)))*w);
            }

            return;
        }

        // Partition [xmin(e0), xmax(e0)] by roots found
        Real x_min = xrange.min(e0);
        Real x_max = xrange.max(e0);
        roots[0] = x_min;
        int nroots = 1;
        if (phi.grad(e0) != Real(0.0)) {
            for (int i = 0; i < psiCount; ++i)
            {
                for (int dim = 0; dim < N; ++dim) {
                    if (!free[dim]) {
                        x[dim] = xrange(psi[i].side(dim),dim);
                    }
                }
                // x is now valid in all variables except e0
                x[e0] = x_min;
                Real phi_lo = phi(x);
                Real xroot = x[e0] - phi_lo / phi.grad(e0);
                if (xroot > x_min && xroot < x_max) {
                    roots[nroots++] = xroot;
                }
            }
            AMREX_ASSERT(nroots <= 3);
        }
        if (nroots == 3 && roots[1] > roots[2]) {
            detail::swap(roots[1],roots[2]);
        }
        roots[nroots++] = x_max;

        // In rare cases, degenerate segments can be found, filter out with a tolerance
        static constexpr Real eps = std::numeric_limits<Real>::epsilon();
        constexpr Real tol = 50.0*eps;

        // Loop over segments of divided interval
        for (int i = 0; i < nroots - 1; ++i)
        {
            if (roots[i+1] - roots[i] < tol) continue;

            // Evaluate sign of phi within segment and check for consistency with psi
            bool okay = true;
            x[e0] = (roots[i] + roots[i+1])*0.5;
            for (int j = 0; j < psiCount && okay; ++j)
            {
                for (int dim = 0; dim < N; ++dim) {
                    if (!free[dim]) {
                        x[dim] = xrange(psi[j].side(dim), dim);
                    }
                }
                bool new_ok = (phi(x) > 0.0) ? (psi[j].sign() >= 0) : (psi[j].sign() <= 0);
                okay = okay && new_ok;
            }
            if (!okay) continue;

            for (int j = 0; j < p; ++j)
            {
                x[e0] = roots[i] + (roots[i+1] - roots[i]) * gauss_x[j];
                Real gw = (roots[i+1] - roots[i]) * gauss_w[j];
                f.evalIntegrand(x, w * gw);
            }
        }
    }